

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::r_formatter<spdlog::details::scoped_padder>::format
          (r_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  int n;
  char *s;
  memory_buf_t *dest_00;
  string_view_t view;
  basic_string_view<char> local_78;
  char local_67 [15];
  undefined1 local_58 [8];
  scoped_padder p;
  size_t field_size;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *param_1_local;
  r_formatter<spdlog::details::scoped_padder> *this_local;
  
  p.spaces_.size_ = 0xb;
  dest_00 = dest;
  scoped_padder::scoped_padder
            ((scoped_padder *)local_58,0xb,&(this->super_flag_formatter).padinfo_,dest);
  n = to12h(tm_time);
  fmt_helper::pad2(n,dest);
  local_67[2] = 0x3a;
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_67 + 2);
  fmt_helper::pad2(tm_time->tm_min,dest);
  local_67[1] = 0x3a;
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_67 + 1);
  fmt_helper::pad2(tm_time->tm_sec,dest);
  local_67[0] = ' ';
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_67);
  s = ampm(tm_time);
  ::fmt::v7::basic_string_view<char>::basic_string_view(&local_78,s);
  view.size_ = (size_t)dest;
  view.data_ = (char *)local_78.size_;
  fmt_helper::append_string_view((fmt_helper *)local_78.data_,view,dest_00);
  scoped_padder::~scoped_padder((scoped_padder *)local_58);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }